

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_decompress.c
# Opt level: O1

int parse_cmdline_decoder
              (int argc,char **argv,opj_decompress_parameters *parameters,img_fol_t *img_fol)

{
  bool bVar1;
  FILE *__stream;
  img_fol_t *piVar2;
  int iVar3;
  OPJ_UINT32 OVar4;
  uint uVar5;
  OPJ_UINT32 *pOVar6;
  opj_precision *poVar7;
  char *pcVar8;
  ulong uVar9;
  size_t sVar10;
  undefined8 uVar11;
  opj_precision_mode oVar12;
  ulong uVar13;
  opj_decompress_parameters *poVar14;
  uint *__src;
  char *pcVar15;
  bool bVar16;
  bool bVar17;
  char mode;
  char optlist [20];
  char outformat [50];
  opj_option_t long_option [7];
  byte local_1e2;
  char local_1e1;
  char **local_1e0;
  img_fol_t *local_1d8;
  int local_1cc;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  opj_decompress_parameters *local_1b0;
  OPJ_UINT32 *local_1a8;
  OPJ_UINT32 *local_1a0;
  OPJ_UINT32 *local_198;
  OPJ_UINT32 *local_190;
  opj_decompress_parameters *local_188;
  OPJ_UINT32 *local_180;
  char local_178 [32];
  uint local_158 [16];
  opj_option_t local_118 [2];
  int *local_c8;
  int *local_a8;
  int *local_88;
  int *local_48;
  
  local_1cc = argc;
  memcpy(local_118,&PTR_anon_var_dwarf_254_0011bba0,0xe0);
  builtin_strncpy(local_178,"i:o:r:l:x:d:t:p:c:h",0x14);
  local_c8 = &parameters->force_rgb;
  local_a8 = &parameters->upsample;
  local_88 = &parameters->split_pnm;
  local_48 = &parameters->quiet;
  opj_reset_options_reading();
  img_fol->set_out_format = '\0';
  local_1b0 = (opj_decompress_parameters *)&parameters->num_threads;
  local_1b8 = parameters->indexfilename;
  local_180 = &parameters->tile_index;
  local_190 = &parameters->DA_x0;
  local_198 = &parameters->DA_y0;
  local_1a0 = &parameters->DA_x1;
  local_1a8 = &parameters->DA_y1;
  local_188 = (opj_decompress_parameters *)&(parameters->core).cp_layer;
  local_1c0 = parameters->outfile;
  local_1c8 = parameters->infile;
  local_1e0 = argv;
  local_1d8 = img_fol;
LAB_00106653:
  while (iVar3 = opj_getopt_long(local_1cc,argv,local_178,local_118,0xe0), pcVar15 = local_1b8,
        __stream = _stdout, __src = (uint *)opj_optarg, iVar3 < 0x54) {
    if (iVar3 != 0) {
      if (iVar3 != 0x4f) {
        if (iVar3 == -1) {
          if (local_1d8->set_imgdir == '\x01') {
            if (parameters->infile[0] != '\0') {
              parse_cmdline_decoder_cold_9();
              return 1;
            }
            if (local_1d8->set_out_format == '\0') {
              parse_cmdline_decoder_cold_11();
              return 1;
            }
            if (parameters->outfile[0] != '\0') {
              parse_cmdline_decoder_cold_10();
              return 1;
            }
          }
          else if ((parameters->infile[0] == '\0') || (parameters->outfile[0] == '\0')) {
            parse_cmdline_decoder_cold_8();
            return 1;
          }
          return 0;
        }
        goto switchD_00106698_caseD_65;
      }
      sprintf((char *)local_158,".%s",opj_optarg);
      piVar2 = local_1d8;
      local_1d8->set_out_format = '\x01';
      iVar3 = get_file_format((char *)local_158);
      parameters->cod_format = iVar3;
      switch(iVar3) {
      case 10:
        piVar2->out_format = "ppm";
        break;
      case 0xb:
        piVar2->out_format = "pgx";
        break;
      case 0xc:
        piVar2->out_format = "bmp";
        break;
      default:
        pcVar15 = 
        "Unknown output format image %s [only *.png, *.pnm, *.pgm, *.ppm, *.pgx, *.bmp, *.tif, *.raw or *.tga]!!\n"
        ;
        __src = local_158;
        goto LAB_00106f18;
      case 0xe:
        piVar2->out_format = "tif";
        break;
      case 0xf:
      case 0x10:
        piVar2->out_format = "raw";
        break;
      case 0x11:
        piVar2->out_format = "png";
        break;
      case 0x12:
        piVar2->out_format = "rawl";
      }
    }
  }
  switch(iVar3) {
  case 99:
    pcVar15 = opj_optarg;
    do {
      uVar5 = parameters->numcomps + 1;
      parameters->numcomps = uVar5;
      pOVar6 = (OPJ_UINT32 *)realloc(parameters->comps_indices,(ulong)uVar5 << 2);
      parameters->comps_indices = pOVar6;
      OVar4 = atoi(pcVar15);
      pOVar6[parameters->numcomps - 1] = OVar4;
      pcVar8 = strchr(pcVar15,0x2c);
      pcVar15 = pcVar8 + 1;
    } while (pcVar8 != (char *)0x0);
    goto LAB_00106653;
  case 100:
    sVar10 = strlen(opj_optarg);
    pcVar15 = (char *)malloc(sVar10 + 1);
    if (pcVar15 == (char *)0x0) {
      parse_cmdline_decoder_cold_5();
      return 1;
    }
    *pcVar15 = '\0';
    memcpy(pcVar15,__src,sVar10 + 1);
    parse_DA_values(pcVar15,local_190,local_198,local_1a0,local_1a8);
    free(pcVar15);
    argv = local_1e0;
    goto LAB_00106653;
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x71:
  case 0x73:
  case 0x75:
  case 0x76:
  case 0x77:
    goto switchD_00106698_caseD_65;
  case 0x68:
    uVar11 = opj_version();
    fprintf(__stream,
            "\nThis is the opj_decompress utility from the OpenJPEG project.\nIt decompresses JPEG 2000 codestreams to various image formats.\nIt has been compiled against openjp2 library v%s.\n\n"
            ,uVar11);
    fwrite("Parameters:\n-----------\n\n  -ImgDir <directory> \n\tImage file Directory path \n  -OutFor <PBM|PGM|PPM|PNM|PAM|PGX|PNG|BMP|TIF|RAW|RAWL|TGA>\n    REQUIRED only if -ImgDir is used\n\tOutput format for decompressed images.\n"
           ,0xd6,1,_stdout);
    fwrite("  -i <compressed file>\n    REQUIRED only if an Input image directory is not specified\n    Currently accepts J2K-files, JP2-files and JPT-files. The file type\n    is identified based on its suffix.\n"
           ,0xc5,1,_stdout);
    fwrite("  -o <decompressed file>\n    REQUIRED\n    Currently accepts formats specified above (see OutFor option)\n    Binary data is written to the file (not ascii). If a PGX\n    filename is given, there will be as many output files as there are\n    components: an indice starting from 0 will then be appended to the\n    output filename, just before the \"pgx\" extension. If a PGM filename\n    is given and there are more than one component, only the first component\n    will be written to the file.\n"
           ,0x1e9,1,_stdout);
    fwrite("  -r <reduce factor>\n    Set the number of highest resolution levels to be discarded. The\n    image resolution is effectively divided by 2 to the power of the\n    number of discarded levels. The reduce factor is limited by the\n    smallest total number of decomposition levels among tiles.\n  -l <number of quality layers to decode>\n    Set the maximum number of quality layers to decode. If there are\n    less quality layers than the specified number, all the quality layers\n    are decoded.\n"
           ,0x1ec,1,_stdout);
    fwrite("  -x  \n    Create an index file *.Idx (-x index_name.Idx) \n  -d <x0,y0,x1,y1>\n    OPTIONAL\n    Decoding area\n    By default all the image is decoded.\n  -t <tile_number>\n    OPTIONAL\n    Set the tile number of the decoded tile. Follow the JPEG2000 convention from left-up to bottom-up\n    By default all tiles are decoded.\n"
           ,0x142,1,_stdout);
    fwrite("  -p <comp 0 precision>[C|S][,<comp 1 precision>[C|S][,...]]\n    OPTIONAL\n    Force the precision (bit depth) of components.\n"
           ,0x7d,1,_stdout);
    fwrite("    There shall be at least 1 value. Theres no limit on the number of values (comma separated, last values ignored if too much values).\n    If there are less values than components, the last value is used for remaining components.\n    If \'C\' is specified (default), values are clipped.\n    If \'S\' is specified, values are scaled.\n    A 0 value can be specified (meaning original bit depth).\n"
           ,0x187,1,_stdout);
    fwrite("  -c first_comp_index[,second_comp_index][,...]\n    OPTIONAL\n    To limit the number of components to decoded.\n    Component indices are numbered starting at 0.\n"
           ,0xa1,1,_stdout);
    fwrite("  -force-rgb\n    Force output image colorspace to RGB\n  -upsample\n    Downsampled components will be upsampled to image size\n  -split-pnm\n    Split output components to different files when writing to PNM\n"
           ,0xcd,1,_stdout);
    iVar3 = opj_has_thread_support();
    if (iVar3 != 0) {
      fwrite("  -threads <num_threads|ALL_CPUS>\n    Number of threads to use for decoding or ALL_CPUS for all available cores.\n"
             ,0x71,1,_stdout);
    }
    fwrite("  -quiet\n    Disable output from the library and other output.\n",0x3f,1,_stdout);
    fputc(10,_stdout);
    return 1;
  case 0x69:
    uVar5 = infile_format(opj_optarg);
    parameters->decod_format = uVar5;
    if (2 < uVar5) {
      if (uVar5 == 0xfffffffe) {
        pcVar15 = "!! infile cannot be read: %s !!\n\n";
      }
      else {
        pcVar15 = 
        "[ERROR] Unknown input file format: %s \n        Known file formats are *.j2k, *.jp2, *.jpc or *.jpt\n"
        ;
      }
LAB_00106f18:
      fprintf(_stderr,pcVar15,__src);
      return 1;
    }
    if (__src == (uint *)0x0) {
      *local_1c8 = '\0';
LAB_00106ea9:
      parse_cmdline_decoder_cold_7();
      return 1;
    }
    if (*(char *)__src == '\0') {
      uVar13 = 0;
    }
    else {
      uVar9 = 0;
      do {
        uVar13 = uVar9 + 1;
        if (*(char *)((long)__src + uVar9 + 1) == '\0') break;
        bVar16 = uVar9 < 0xfff;
        uVar9 = uVar13;
      } while (bVar16);
    }
    pcVar15 = local_1c8;
    if (0xfff < uVar13) goto LAB_00106ea9;
    goto LAB_00106c10;
  case 0x6c:
    pcVar15 = "%u";
    poVar14 = local_188;
    goto LAB_00106b1a;
  case 0x6f:
    uVar5 = get_file_format(opj_optarg);
    parameters->cod_format = uVar5;
    if ((0x12 < uVar5) || ((0x7dc00U >> (uVar5 & 0x1f) & 1) == 0)) {
      pcVar15 = 
      "Unknown output format image %s [only *.png, *.pnm, *.pgm, *.ppm, *.pgx, *.bmp, *.tif, *.raw or *.tga]!!\n"
      ;
      goto LAB_00106f18;
    }
    if (__src == (uint *)0x0) {
      *local_1c0 = '\0';
LAB_00106e9a:
      parse_cmdline_decoder_cold_6();
      return 1;
    }
    if (*(char *)__src == '\0') {
      uVar13 = 0;
    }
    else {
      uVar9 = 0;
      do {
        uVar13 = uVar9 + 1;
        if (*(char *)((long)__src + uVar9 + 1) == '\0') break;
        bVar16 = uVar9 < 0xfff;
        uVar9 = uVar13;
      } while (bVar16);
    }
    pcVar15 = local_1c0;
    if (0xfff < uVar13) goto LAB_00106e9a;
LAB_00106c10:
    memcpy(pcVar15,__src,uVar13);
    pcVar15[uVar13] = '\0';
    argv = local_1e0;
    goto LAB_00106653;
  case 0x70:
    break;
  case 0x72:
    pcVar15 = "%u";
    poVar14 = parameters;
LAB_00106b1a:
    __isoc99_sscanf(__src,pcVar15,poVar14);
    goto LAB_00106653;
  case 0x74:
    __isoc99_sscanf(opj_optarg,"%u",local_180);
    parameters->nb_tile_to_decode = 1;
    goto LAB_00106653;
  case 0x78:
    if (opj_optarg == (char *)0x0) {
      *local_1b8 = '\0';
    }
    else {
      if (*opj_optarg == '\0') {
        uVar13 = 0;
      }
      else {
        uVar9 = 0;
        do {
          uVar13 = uVar9 + 1;
          if (opj_optarg[uVar9 + 1] == '\0') break;
          bVar16 = uVar9 < 0xfff;
          uVar9 = uVar13;
        } while (bVar16);
      }
      if (uVar13 < 0x1000) {
        memcpy(local_1b8,opj_optarg,uVar13);
        pcVar15[uVar13] = '\0';
        goto LAB_00106653;
      }
    }
    parse_cmdline_decoder_cold_4();
    return 1;
  case 0x79:
    sVar10 = strlen(opj_optarg);
    pcVar15 = (char *)malloc(sVar10 + 1);
    piVar2 = local_1d8;
    local_1d8->imgdirpath = pcVar15;
    if (pcVar15 == (char *)0x0) {
      return 1;
    }
    strcpy(pcVar15,opj_optarg);
    piVar2->set_imgdir = '\x01';
    goto LAB_00106653;
  default:
    if (iVar3 == 0x54) {
      iVar3 = strcmp(opj_optarg,"ALL_CPUS");
      if (iVar3 != 0) {
        pcVar15 = "%d";
        poVar14 = local_1b0;
        goto LAB_00106b1a;
      }
      iVar3 = opj_get_num_cpus();
      if (iVar3 == 1) {
        iVar3 = 0;
      }
      parameters->num_threads = iVar3;
      goto LAB_00106653;
    }
switchD_00106698_caseD_65:
    parse_cmdline_decoder_cold_12();
    goto LAB_00106653;
  }
  if (parameters->precision != (opj_precision *)0x0) {
    free(parameters->precision);
    parameters->precision = (opj_precision *)0x0;
  }
  parameters->nb_precision = 0;
  bVar16 = true;
  pcVar15 = (char *)__src;
  do {
    iVar3 = __isoc99_sscanf(pcVar15,"%d%c%c",local_158,&local_1e2,&local_1e1);
    if (iVar3 == 1) {
      local_1e2 = 0x43;
      iVar3 = 2;
    }
    if (local_1e2 == 0x2c || iVar3 == 2) {
      if (local_1e2 == 0x2c) {
        local_1e2 = 0x43;
      }
      local_1e1 = ',';
      iVar3 = 3;
    }
    if (iVar3 == 3) {
      uVar13 = (ulong)local_158[0];
      if (local_158[0] - 0x21 < 0xffffffe0) {
        pcVar8 = "Invalid precision %d in precision option %s\n";
LAB_00106984:
        fprintf(_stderr,pcVar8,uVar13,__src);
        goto LAB_0010698e;
      }
      uVar13 = (ulong)(uint)(int)(char)local_1e2;
      if ((local_1e2 & 0xef) != 0x43) {
        pcVar8 = "Invalid precision mode %c in precision option %s\n";
        goto LAB_00106984;
      }
      uVar13 = (ulong)(uint)(int)local_1e1;
      if ((int)local_1e1 != 0x2c) {
        pcVar8 = "Invalid character %c in precision option %s\n";
        goto LAB_00106984;
      }
      if (parameters->precision == (opj_precision *)0x0) {
        poVar7 = (opj_precision *)malloc(8);
        parameters->precision = poVar7;
        if (poVar7 == (opj_precision *)0x0) {
          parse_cmdline_decoder_cold_3();
          goto LAB_0010698e;
        }
LAB_001068c8:
        poVar7 = parameters->precision;
        uVar5 = parameters->nb_precision;
        poVar7[uVar5].prec = local_158[0];
        if (local_1e2 == 0x43) {
          oVar12 = OPJ_PREC_MODE_CLIP;
LAB_001068f7:
          poVar7[uVar5].mode = oVar12;
        }
        else if (local_1e2 == 0x53) {
          oVar12 = OPJ_PREC_MODE_SCALE;
          goto LAB_001068f7;
        }
        parameters->nb_precision = uVar5 + 1;
        pcVar8 = strchr(pcVar15,0x2c);
        pcVar15 = pcVar8 + 1;
        bVar17 = pcVar8 == (char *)0x0;
        if (bVar17) {
          pcVar15 = (char *)0x0;
        }
      }
      else {
        uVar5 = parameters->nb_precision + 1;
        if (uVar5 == 0) {
          parse_cmdline_decoder_cold_2();
LAB_001069a9:
          bVar1 = false;
          bVar17 = true;
          bVar16 = false;
        }
        else {
          poVar7 = (opj_precision *)realloc(parameters->precision,(ulong)uVar5 << 3);
          if (poVar7 == (opj_precision *)0x0) {
            parse_cmdline_decoder_cold_1();
            goto LAB_001069a9;
          }
          parameters->precision = poVar7;
          bVar17 = false;
          bVar1 = true;
        }
        if (bVar1) goto LAB_001068c8;
      }
    }
    else {
      fprintf(_stderr,"Could not parse precision option %s\n",__src);
LAB_0010698e:
      bVar16 = false;
      bVar17 = true;
    }
  } while (!bVar17);
  argv = local_1e0;
  if (!bVar16) {
    return 1;
  }
  goto LAB_00106653;
}

Assistant:

int parse_cmdline_decoder(int argc, char **argv,
                          opj_decompress_parameters *parameters, img_fol_t *img_fol)
{
    /* parse the command line */
    int totlen, c;
    opj_option_t long_option[] = {
        {"ImgDir",    REQ_ARG, NULL, 'y'},
        {"OutFor",    REQ_ARG, NULL, 'O'},
        {"force-rgb", NO_ARG,  NULL, 1},
        {"upsample",  NO_ARG,  NULL, 1},
        {"split-pnm", NO_ARG,  NULL, 1},
        {"threads",   REQ_ARG, NULL, 'T'},
        {"quiet", NO_ARG,  NULL, 1},
    };

    const char optlist[] = "i:o:r:l:x:d:t:p:c:"

                           /* UniPG>> */
#ifdef USE_JPWL
                           "W:"
#endif /* USE_JPWL */
                           /* <<UniPG */
                           "h"     ;

    long_option[2].flag = &(parameters->force_rgb);
    long_option[3].flag = &(parameters->upsample);
    long_option[4].flag = &(parameters->split_pnm);
    long_option[6].flag = &(parameters->quiet);
    totlen = sizeof(long_option);
    opj_reset_options_reading();
    img_fol->set_out_format = 0;
    do {
        c = opj_getopt_long(argc, argv, optlist, long_option, totlen);
        if (c == -1) {
            break;
        }
        switch (c) {
        case 0: /* long opt with flag */
            break;
        case 'i': {         /* input file */
            char *infile = opj_optarg;
            parameters->decod_format = infile_format(infile);
            switch (parameters->decod_format) {
            case J2K_CFMT:
                break;
            case JP2_CFMT:
                break;
            case JPT_CFMT:
                break;
            case -2:
                fprintf(stderr,
                        "!! infile cannot be read: %s !!\n\n",
                        infile);
                return 1;
            default:
                fprintf(stderr,
                        "[ERROR] Unknown input file format: %s \n"
                        "        Known file formats are *.j2k, *.jp2, *.jpc or *.jpt\n",
                        infile);
                return 1;
            }
            if (opj_strcpy_s(parameters->infile, sizeof(parameters->infile), infile) != 0) {
                fprintf(stderr, "[ERROR] Path is too long\n");
                return 1;
            }
        }
        break;

        /* ----------------------------------------------------- */

        case 'o': {         /* output file */
            char *outfile = opj_optarg;
            parameters->cod_format = get_file_format(outfile);
            switch (parameters->cod_format) {
            case PGX_DFMT:
                break;
            case PXM_DFMT:
                break;
            case BMP_DFMT:
                break;
            case TIF_DFMT:
                break;
            case RAW_DFMT:
                break;
            case RAWL_DFMT:
                break;
            case TGA_DFMT:
                break;
            case PNG_DFMT:
                break;
            default:
                fprintf(stderr,
                        "Unknown output format image %s [only *.png, *.pnm, *.pgm, *.ppm, *.pgx, *.bmp, *.tif, *.raw or *.tga]!!\n",
                        outfile);
                return 1;
            }
            if (opj_strcpy_s(parameters->outfile, sizeof(parameters->outfile),
                             outfile) != 0) {
                fprintf(stderr, "[ERROR] Path is too long\n");
                return 1;
            }
        }
        break;

        /* ----------------------------------------------------- */

        case 'O': {         /* output format */
            char outformat[50];
            char *of = opj_optarg;
            sprintf(outformat, ".%s", of);
            img_fol->set_out_format = 1;
            parameters->cod_format = get_file_format(outformat);
            switch (parameters->cod_format) {
            case PGX_DFMT:
                img_fol->out_format = "pgx";
                break;
            case PXM_DFMT:
                img_fol->out_format = "ppm";
                break;
            case BMP_DFMT:
                img_fol->out_format = "bmp";
                break;
            case TIF_DFMT:
                img_fol->out_format = "tif";
                break;
            case RAW_DFMT:
                img_fol->out_format = "raw";
                break;
            case RAWL_DFMT:
                img_fol->out_format = "rawl";
                break;
            case TGA_DFMT:
                img_fol->out_format = "raw";
                break;
            case PNG_DFMT:
                img_fol->out_format = "png";
                break;
            default:
                fprintf(stderr,
                        "Unknown output format image %s [only *.png, *.pnm, *.pgm, *.ppm, *.pgx, *.bmp, *.tif, *.raw or *.tga]!!\n",
                        outformat);
                return 1;
                break;
            }
        }
        break;

        /* ----------------------------------------------------- */


        case 'r': {     /* reduce option */
            sscanf(opj_optarg, "%u", &(parameters->core.cp_reduce));
        }
        break;

        /* ----------------------------------------------------- */


        case 'l': {     /* layering option */
            sscanf(opj_optarg, "%u", &(parameters->core.cp_layer));
        }
        break;

        /* ----------------------------------------------------- */

        case 'h':           /* display an help description */
            decode_help_display();
            return 1;

        /* ----------------------------------------------------- */

        case 'y': {         /* Image Directory path */
            img_fol->imgdirpath = (char*)malloc(strlen(opj_optarg) + 1);
            if (img_fol->imgdirpath == NULL) {
                return 1;
            }
            strcpy(img_fol->imgdirpath, opj_optarg);
            img_fol->set_imgdir = 1;
        }
        break;

        /* ----------------------------------------------------- */

        case 'd': {         /* Input decode ROI */
            size_t size_optarg = (size_t)strlen(opj_optarg) + 1U;
            char *ROI_values = (char*) malloc(size_optarg);
            if (ROI_values == NULL) {
                fprintf(stderr, "[ERROR] Couldn't allocate memory\n");
                return 1;
            }
            ROI_values[0] = '\0';
            memcpy(ROI_values, opj_optarg, size_optarg);
            /*printf("ROI_values = %s [%d / %d]\n", ROI_values, strlen(ROI_values), size_optarg ); */
            parse_DA_values(ROI_values, &parameters->DA_x0, &parameters->DA_y0,
                            &parameters->DA_x1, &parameters->DA_y1);

            free(ROI_values);
        }
        break;

        /* ----------------------------------------------------- */

        case 't': {         /* Input tile index */
            sscanf(opj_optarg, "%u", &parameters->tile_index);
            parameters->nb_tile_to_decode = 1;
        }
        break;

        /* ----------------------------------------------------- */

        case 'x': {         /* Creation of index file */
            if (opj_strcpy_s(parameters->indexfilename, sizeof(parameters->indexfilename),
                             opj_optarg) != 0) {
                fprintf(stderr, "[ERROR] Path is too long\n");
                return 1;
            }
        }
        break;

        /* ----------------------------------------------------- */
        case 'p': { /* Force precision */
            if (!parse_precision(opj_optarg, parameters)) {
                return 1;
            }
        }
        break;

        /* ----------------------------------------------------- */
        case 'c': { /* Componenets */
            const char* iter = opj_optarg;
            while (1) {
                parameters->numcomps ++;
                parameters->comps_indices = (OPJ_UINT32*) realloc(
                                                parameters->comps_indices,
                                                parameters->numcomps * sizeof(OPJ_UINT32));
                parameters->comps_indices[parameters->numcomps - 1] =
                    (OPJ_UINT32) atoi(iter);
                iter = strchr(iter, ',');
                if (iter == NULL) {
                    break;
                }
                iter ++;
            }
        }
        break;
            /* ----------------------------------------------------- */

            /* UniPG>> */
#ifdef USE_JPWL

        case 'W': {         /* activate JPWL correction */
            char *token = NULL;

            token = strtok(opj_optarg, ",");
            while (token != NULL) {

                /* search expected number of components */
                if (*token == 'c') {

                    static int compno;

                    compno = JPWL_EXPECTED_COMPONENTS; /* predefined no. of components */

                    if (sscanf(token, "c=%d", &compno) == 1) {
                        /* Specified */
                        if ((compno < 1) || (compno > 256)) {
                            fprintf(stderr, "ERROR -> invalid number of components c = %d\n", compno);
                            return 1;
                        }
                        parameters->jpwl_exp_comps = compno;

                    } else if (!strcmp(token, "c")) {
                        /* default */
                        parameters->jpwl_exp_comps = compno; /* auto for default size */

                    } else {
                        fprintf(stderr, "ERROR -> invalid components specified = %s\n", token);
                        return 1;
                    };
                }

                /* search maximum number of tiles */
                if (*token == 't') {

                    static int tileno;

                    tileno = JPWL_MAXIMUM_TILES; /* maximum no. of tiles */

                    if (sscanf(token, "t=%d", &tileno) == 1) {
                        /* Specified */
                        if ((tileno < 1) || (tileno > JPWL_MAXIMUM_TILES)) {
                            fprintf(stderr, "ERROR -> invalid number of tiles t = %d\n", tileno);
                            return 1;
                        }
                        parameters->jpwl_max_tiles = tileno;

                    } else if (!strcmp(token, "t")) {
                        /* default */
                        parameters->jpwl_max_tiles = tileno; /* auto for default size */

                    } else {
                        fprintf(stderr, "ERROR -> invalid tiles specified = %s\n", token);
                        return 1;
                    };
                }

                /* next token or bust */
                token = strtok(NULL, ",");
            };
            parameters->jpwl_correct = OPJ_TRUE;
            if (!(parameter->quiet)) {
                fprintf(stdout, "JPWL correction capability activated\n");
                fprintf(stdout, "- expecting %d components\n", parameters->jpwl_exp_comps);
            }
        }
        break;
#endif /* USE_JPWL */
        /* <<UniPG */

        /* ----------------------------------------------------- */
        case 'T': { /* Number of threads */
            if (strcmp(opj_optarg, "ALL_CPUS") == 0) {
                parameters->num_threads = opj_get_num_cpus();
                if (parameters->num_threads == 1) {
                    parameters->num_threads = 0;
                }
            } else {
                sscanf(opj_optarg, "%d", &parameters->num_threads);
            }
        }
        break;

        /* ----------------------------------------------------- */

        default:
            fprintf(stderr, "[WARNING] An invalid option has been ignored.\n");
            break;
        }
    } while (c != -1);

    /* check for possible errors */
    if (img_fol->set_imgdir == 1) {
        if (!(parameters->infile[0] == 0)) {
            fprintf(stderr, "[ERROR] options -ImgDir and -i cannot be used together.\n");
            return 1;
        }
        if (img_fol->set_out_format == 0) {
            fprintf(stderr,
                    "[ERROR] When -ImgDir is used, -OutFor <FORMAT> must be used.\n");
            fprintf(stderr, "Only one format allowed.\n"
                    "Valid format are PGM, PPM, PNM, PGX, BMP, TIF, RAW and TGA.\n");
            return 1;
        }
        if (!((parameters->outfile[0] == 0))) {
            fprintf(stderr, "[ERROR] options -ImgDir and -o cannot be used together.\n");
            return 1;
        }
    } else {
        if ((parameters->infile[0] == 0) || (parameters->outfile[0] == 0)) {
            fprintf(stderr, "[ERROR] Required parameters are missing\n"
                    "Example: %s -i image.j2k -o image.pgm\n", argv[0]);
            fprintf(stderr, "   Help: %s -h\n", argv[0]);
            return 1;
        }
    }

    return 0;
}